

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_GpuBuffer.H
# Opt level: O0

void __thiscall amrex::Gpu::Buffer<int,_0>::clear(Buffer<int,_0> *this)

{
  long in_RDI;
  
  free(*(void **)(in_RDI + 0x10));
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  return;
}

Assistant:

void clear ()
    {
#ifdef AMREX_USE_GPU
        if (d_data) The_Arena()->free(d_data);
        if (h_data) The_Pinned_Arena()->free(h_data);
#else
        std::free(h_data);
#endif
        d_data = nullptr;
        h_data = nullptr;
    }